

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vraster.cpp
# Opt level: O1

void __thiscall FTOutline::moveTo(FTOutline *this,VPointF *pt)

{
  short *psVar1;
  short sVar2;
  SW_FT_Vector *pSVar3;
  
  pSVar3 = (this->ft).points;
  sVar2 = (this->ft).n_points;
  pSVar3[sVar2].x = (long)(pt->mx * 64.0);
  pSVar3[sVar2].y = (long)(pt->my * 64.0);
  (this->ft).tags[sVar2] = '\x01';
  sVar2 = (this->ft).n_points;
  if (sVar2 != 0) {
    (this->ft).contours[(this->ft).n_contours] = sVar2 + -1;
    (this->ft).n_contours = (this->ft).n_contours + 1;
  }
  (this->ft).contours_flag[(this->ft).n_contours] = '\x01';
  psVar1 = &(this->ft).n_points;
  *psVar1 = *psVar1 + 1;
  return;
}

Assistant:

void FTOutline::moveTo(const VPointF &pt)
{
    assert(ft.n_points <= SHRT_MAX - 1);

    ft.points[ft.n_points].x = TO_FT_COORD(pt.x());
    ft.points[ft.n_points].y = TO_FT_COORD(pt.y());
    ft.tags[ft.n_points] = SW_FT_CURVE_TAG_ON;
    if (ft.n_points) {
        ft.contours[ft.n_contours] = ft.n_points - 1;
        ft.n_contours++;
    }
    // mark the current contour as open
    // will be updated if ther is a close tag at the end.
    ft.contours_flag[ft.n_contours] = 1;

    ft.n_points++;
}